

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

float dyy(qnode_ptr_t q,int x,int y,int z)

{
  int h_00;
  int iVar1;
  int local_24;
  int h;
  int i;
  float d;
  int z_local;
  int y_local;
  int x_local;
  qnode_ptr_t q_local;
  
  h_00 = C.m / 2;
  h = 0;
  iVar1 = overflow(x,y,q->sizy,q->sizx,q->ofst,h_00,2);
  if (iVar1 == 0) {
    (*q->param_ptr[z])[q->res * x + y].err = 0;
    for (local_24 = -h_00; local_24 <= h_00; local_24 = local_24 + 1) {
      h = (int)((*q->param_ptr[z])[q->res * x + y + local_24].fy * C.k[local_24 + h_00] + (float)h);
    }
    h = (int)((float)h / C.f);
  }
  else {
    (*q->param_ptr[z])[q->res * x + y].err = 1;
  }
  return (float)h;
}

Assistant:

float dyy(q,x,y,z)
qnode_ptr_t q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,q->sizy,q->sizx,q->ofst,h,2)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[q->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*q->param_ptr[z])[q->res*x + y+i].fy*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}